

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaLinkLineComputer.cxx
# Opt level: O0

string * __thiscall
cmNinjaLinkLineComputer::ConvertToLinkReference
          (string *__return_storage_ptr__,cmNinjaLinkLineComputer *this,string *lib)

{
  string *psVar1;
  string *lib_local;
  cmNinjaLinkLineComputer *this_local;
  
  psVar1 = cmGlobalNinjaGenerator::ConvertToNinjaPath(this->GG,lib);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaLinkLineComputer::ConvertToLinkReference(
  std::string const& lib) const
{
  return GG->ConvertToNinjaPath(lib);
}